

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int idaLsPrecSolveB(sunrealtype tt,N_Vector yyB,N_Vector ypB,N_Vector rrB,N_Vector rvecB,
                   N_Vector zvecB,sunrealtype c_jB,sunrealtype deltaB,void *ida_mem)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  int retval;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem *in_stack_ffffffffffffff78;
  IDAadjMem *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  long lVar2;
  long lVar3;
  int local_4;
  
  lVar3 = 0;
  lVar2 = 0;
  idaLs_AccessLMemBCur
            ((void *)0x0,(char *)0x0,
             (IDAMem *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(IDALsMemB *)0x137a30);
  if ((iRam00000000000000c0 == 0) &&
     (iVar1 = (*pcRam0000000000000098)(in_XMM0_Qa,0,uRam0000000000000158,uRam0000000000000160,0),
     iVar1 != 0)) {
    IDAProcessError(*(IDAMem *)(lVar2 + 0x10),-1,0x950,"idaLsPrecSolveB",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                    ,"Bad t for interpolation.");
    local_4 = -1;
  }
  else {
    local_4 = (**(code **)(lVar3 + 0x40))
                        (in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,uRam0000000000000158,uRam0000000000000160,
                         in_RDI,in_RSI,in_RDX,in_RCX,in_R8,*(undefined8 *)(lVar2 + 0x40));
  }
  return local_4;
}

Assistant:

static int idaLsPrecSolveB(sunrealtype tt, N_Vector yyB, N_Vector ypB,
                           N_Vector rrB, N_Vector rvecB, N_Vector zvecB,
                           sunrealtype c_jB, sunrealtype deltaB, void* ida_mem)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDALsMemB idalsB_mem;
  IDABMem IDAB_mem;
  int retval;

  /* access relevant memory structures */
  IDA_mem    = NULL;
  IDAADJ_mem = NULL;
  idalsB_mem = NULL;
  IDAB_mem   = NULL;
  retval     = idaLs_AccessLMemBCur(ida_mem, __func__, &IDA_mem, &IDAADJ_mem,
                                    &IDAB_mem, &idalsB_mem);

  /* Get forward solution from interpolation. */
  if (IDAADJ_mem->ia_noInterp == SUNFALSE)
  {
    retval = IDAADJ_mem->ia_getY(IDA_mem, tt, IDAADJ_mem->ia_yyTmp,
                                 IDAADJ_mem->ia_ypTmp, NULL, NULL);
    if (retval != IDA_SUCCESS)
    {
      IDAProcessError(IDAB_mem->IDA_mem, -1, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_T);
      return (-1);
    }
  }

  /* Call user's adjoint psolveB routine */
  return (idalsB_mem->psolveB(tt, IDAADJ_mem->ia_yyTmp, IDAADJ_mem->ia_ypTmp,
                              yyB, ypB, rrB, rvecB, zvecB, c_jB, deltaB,
                              IDAB_mem->ida_user_data));
}